

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O3

Local __thiscall Wasm::WasmSignature::GetResult(WasmSignature *this,uint32 index)

{
  WasmCompilationException *this_00;
  
  if (index < this->m_resultsCount) {
    return (this->m_results).ptr[index];
  }
  this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_00,L"Result %u out of range (max %u)",(ulong)index,(ulong)this->m_resultsCount);
  __cxa_throw(this_00,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

Wasm::Local WasmSignature::GetResult(uint32 index) const
{
    if (index >= GetResultCount())
    {
        throw WasmCompilationException(_u("Result %u out of range (max %u)"), index, GetResultCount());
    }
    return m_results[index];
}